

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.cpp
# Opt level: O2

ssize_t __thiscall
brynet::net::TCPSession::send(TCPSession *this,int __fd,void *__buf,size_t __n,int __flags)

{
  shared_ptr<brynet::net::IOLoopData> *ioLoopData;
  ssize_t extraout_RAX;
  undefined4 in_register_00000084;
  char *in_stack_ffffffffffffffc8;
  undefined1 local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  ioLoopData = (shared_ptr<brynet::net::IOLoopData> *)this->mSocketID;
  DataSocket::makePacket_abi_cxx11_(in_stack_ffffffffffffffc8,0x132f88);
  IOLoopDataSend((net *)&this->mIoLoopData,ioLoopData,(SESSION_TYPE)local_30,(PACKET_PTR *)__n,
                 (PACKED_SENDED_CALLBACK *)CONCAT44(in_register_00000084,__flags));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return extraout_RAX;
}

Assistant:

void TCPSession::send(const char* buffer, 
    size_t len, 
    const DataSocket::PACKED_SENDED_CALLBACK& callback) const
{
    IOLoopDataSend(mIoLoopData, mSocketID, DataSocket::makePacket(buffer, len), callback);
}